

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O1

deSocketAddress * deSocketAddress_create(void)

{
  deSocketAddress *pdVar1;
  
  pdVar1 = (deSocketAddress *)deCalloc(0x18);
  if (pdVar1 != (deSocketAddress *)0x0) {
    pdVar1->family = DE_SOCKETFAMILY_INET4;
    pdVar1->type = DE_SOCKETTYPE_STREAM;
    pdVar1->protocol = DE_SOCKETPROTOCOL_TCP;
  }
  return pdVar1;
}

Assistant:

deSocketAddress* deSocketAddress_create (void)
{
	deSocketAddress* addr = (deSocketAddress*)deCalloc(sizeof(deSocketAddress));
	if (!addr)
		return addr;

	/* Sane defaults. */
	addr->family	= DE_SOCKETFAMILY_INET4;
	addr->type		= DE_SOCKETTYPE_STREAM;
	addr->protocol	= DE_SOCKETPROTOCOL_TCP;

	return addr;
}